

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall
tetgenmesh::circumsphere
          (tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double *cent,double *radius)

{
  bool bVar1;
  double dVar2;
  int local_108 [2];
  int indx [4];
  double local_f0;
  double D;
  double rhs [4];
  double A [4] [4];
  double *cent_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  tetgenmesh *this_local;
  
  rhs[3] = *pb - *pa;
  A[0][0] = pb[1] - pa[1];
  A[0][1] = pb[2] - pa[2];
  A[0][3] = *pc - *pa;
  A[1][0] = pc[1] - pa[1];
  A[1][1] = pc[2] - pa[2];
  if (pd == (double *)0x0) {
    cross(this,rhs + 3,A[0] + 3,A[1] + 3);
  }
  else {
    A[1][3] = *pd - *pa;
    A[2][0] = pd[1] - pa[1];
    A[2][1] = pd[2] - pa[2];
  }
  dVar2 = dot(this,rhs + 3,rhs + 3);
  D = dVar2 * 0.5;
  dVar2 = dot(this,A[0] + 3,A[0] + 3);
  rhs[0] = dVar2 * 0.5;
  if (pd == (double *)0x0) {
    rhs[1] = 0.0;
  }
  else {
    dVar2 = dot(this,A[1] + 3,A[1] + 3);
    rhs[1] = dVar2 * 0.5;
  }
  bVar1 = lu_decmp(this,(double (*) [4])(rhs + 3),3,local_108,&local_f0,0);
  if (bVar1) {
    lu_solve(this,(double (*) [4])(rhs + 3),3,local_108,&D,0);
    if (cent != (double *)0x0) {
      *cent = *pa + D;
      cent[1] = pa[1] + rhs[0];
      cent[2] = pa[2] + rhs[1];
    }
    if (radius != (double *)0x0) {
      dVar2 = sqrt(rhs[1] * rhs[1] + D * D + rhs[0] * rhs[0]);
      *radius = dVar2;
    }
    this_local._7_1_ = true;
  }
  else {
    if (radius != (double *)0x0) {
      *radius = 0.0;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool tetgenmesh::circumsphere(REAL* pa, REAL* pb, REAL* pc, REAL* pd, 
                              REAL* cent, REAL* radius)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];

  // Compute the coefficient matrix A (3x3).
  A[0][0] = pb[0] - pa[0];
  A[0][1] = pb[1] - pa[1];
  A[0][2] = pb[2] - pa[2];
  A[1][0] = pc[0] - pa[0];
  A[1][1] = pc[1] - pa[1];
  A[1][2] = pc[2] - pa[2];
  if (pd != NULL) {
    A[2][0] = pd[0] - pa[0];
    A[2][1] = pd[1] - pa[1]; 
    A[2][2] = pd[2] - pa[2];
  } else {
    cross(A[0], A[1], A[2]);
  }

  // Compute the right hand side vector b (3x1).
  rhs[0] = 0.5 * dot(A[0], A[0]);
  rhs[1] = 0.5 * dot(A[1], A[1]);
  if (pd != NULL) {
    rhs[2] = 0.5 * dot(A[2], A[2]);
  } else {
    rhs[2] = 0.0;
  }

  // Solve the 3 by 3 equations use LU decomposition with partial pivoting
  //   and backward and forward substitute..
  if (!lu_decmp(A, 3, indx, &D, 0)) {
    if (radius != (REAL *) NULL) *radius = 0.0;
    return false;
  }    
  lu_solve(A, 3, indx, rhs, 0);
  if (cent != (REAL *) NULL) {
    cent[0] = pa[0] + rhs[0];
    cent[1] = pa[1] + rhs[1];
    cent[2] = pa[2] + rhs[2];
  }
  if (radius != (REAL *) NULL) {
    *radius = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);
  }
  return true;
}